

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

BranchInstr * __thiscall
Lowerer::InsertCompareBranch
          (Lowerer *this,Opnd *compareSrc1,Opnd *compareSrc2,OpCode branchOpCode,bool isUnsigned,
          LabelInstr *target,Instr *insertBeforeInstr,bool ignoreNaN)

{
  ushort uVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  BranchInstr *pBVar6;
  IntConstOpnd *pIVar7;
  AddrOpnd *pAVar8;
  Opnd *this_00;
  uint uVar9;
  Opnd *local_38;
  
  uVar9 = (uint)branchOpCode;
  if (compareSrc1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3da0,"(compareSrc1)","compareSrc1");
    if (!bVar3) goto LAB_0055b636;
    *puVar5 = 0;
  }
  if (compareSrc2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3da1,"(compareSrc2)","compareSrc2");
    if (!bVar3) goto LAB_0055b636;
    *puVar5 = 0;
  }
  func = insertBeforeInstr->m_func;
  if ((byte)(compareSrc1->m_type - TyFloat32) < 2) {
    if (1 < (byte)(compareSrc2->m_type - TyFloat32)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3da7,"(compareSrc2->IsFloat())","compareSrc2->IsFloat()");
      if (!bVar3) goto LAB_0055b636;
      *puVar5 = 0;
    }
    if (isUnsigned) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3da8,"(!isUnsigned)","!isUnsigned");
      if (!bVar3) {
LAB_0055b636:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pBVar6 = IR::BranchInstr::New(branchOpCode,target,compareSrc1,compareSrc2,func);
    IR::Instr::InsertBefore(insertBeforeInstr,&pBVar6->super_Instr);
    pBVar6 = LowererMD::LowerFloatCondBranch(pBVar6,ignoreNaN);
    return pBVar6;
  }
  uVar4 = uVar9 - 0xc;
  this_00 = compareSrc1;
  if (((ushort)uVar4 < 8) && ((0xf3U >> (uVar4 & 0x1f) & 1) != 0)) {
    uVar1 = *(ushort *)(&DAT_00e7a180 + (ulong)(uVar4 & 0xffff) * 2);
    bVar3 = IR::Opnd::IsIntConstOpnd(compareSrc1);
    local_38 = compareSrc2;
    if ((((bVar3) ||
         ((bVar3 = IR::Opnd::IsAddrOpnd(compareSrc1), bVar3 &&
          (pAVar8 = IR::Opnd::AsAddrOpnd(compareSrc1),
          (Var)(long)(int)pAVar8->m_address == pAVar8->m_address)))) &&
        (bVar3 = IR::Opnd::IsIntConstOpnd(compareSrc2), !bVar3)) &&
       (bVar3 = IR::Opnd::IsAddrOpnd(compareSrc2), !bVar3)) {
      this_00 = compareSrc2;
      uVar9 = (uint)uVar1;
      local_38 = compareSrc1;
    }
    branchOpCode = (OpCode)uVar9;
    bVar3 = IR::Opnd::IsRegOpnd(this_00);
    compareSrc2 = local_38;
    if (bVar3) {
      bVar3 = IR::Opnd::IsIntConstOpnd(local_38);
      if ((bVar3) &&
         (pIVar7 = IR::Opnd::AsIntConstOpnd(local_38),
         (pIVar7->super_EncodableOpnd<long>).m_value == 0)) {
        if (branchOpCode != BrGt_A) {
          if (uVar9 != 0x13) goto LAB_0055b5be;
          goto LAB_0055b61f;
        }
      }
      else {
        bVar3 = IR::Opnd::IsAddrOpnd(local_38);
        if (((bVar3) && (pAVar8 = IR::Opnd::AsAddrOpnd(local_38), branchOpCode != BrGt_A)) &&
           (pAVar8->m_address == (Var)0x0)) {
          if (branchOpCode != BrLe_A) {
LAB_0055b5be:
            if ((branchOpCode & ~MediumLayoutPrefix) == BrGe_A) {
              if (isUnsigned) goto LAB_0055b509;
              branchOpCode = LowererMD::MDCompareWithZeroBranchOpcode(branchOpCode);
            }
            if ((local_38->field_0xb & 2) == 0) {
              IR::Opnd::Free(local_38,func);
            }
            InsertTest(this_00,this_00,insertBeforeInstr);
            goto LAB_0055b517;
          }
LAB_0055b61f:
          branchOpCode = BrLe_A;
        }
      }
    }
  }
LAB_0055b509:
  InsertCompare(this_00,compareSrc2,insertBeforeInstr);
LAB_0055b517:
  pBVar6 = InsertBranch(branchOpCode,isUnsigned,target,insertBeforeInstr);
  return pBVar6;
}

Assistant:

IR::BranchInstr *Lowerer::InsertCompareBranch(
    IR::Opnd *compareSrc1,
    IR::Opnd *compareSrc2,
    Js::OpCode branchOpCode,
    const bool isUnsigned,
    IR::LabelInstr *const target,
    IR::Instr *const insertBeforeInstr,
    const bool ignoreNaN)
{
    Assert(compareSrc1);
    Assert(compareSrc2);

    Func *const func = insertBeforeInstr->m_func;

    if(compareSrc1->IsFloat())
    {
        Assert(compareSrc2->IsFloat());
        Assert(!isUnsigned);
        IR::BranchInstr *const instr = IR::BranchInstr::New(branchOpCode, target, compareSrc1, compareSrc2, func);
        insertBeforeInstr->InsertBefore(instr);
        return LowererMD::LowerFloatCondBranch(instr, ignoreNaN);
    }
#ifdef _M_IX86
    else if (compareSrc1->IsInt64())
    {
        Assert(compareSrc2->IsInt64());
        IR::BranchInstr *const instr = IR::BranchInstr::New(branchOpCode, target, compareSrc1, compareSrc2, func);
        insertBeforeInstr->InsertBefore(instr);
        m_lowererMD.EmitInt64Instr(instr);
        return instr;
    }
#endif

    Js::OpCode swapSrcsBranchOpCode;
    switch(branchOpCode)
    {
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrNeq_A:
            swapSrcsBranchOpCode = branchOpCode;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrGe_A:
            swapSrcsBranchOpCode = Js::OpCode::BrLe_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrGt_A:
            swapSrcsBranchOpCode = Js::OpCode::BrLt_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrLe_A:
            swapSrcsBranchOpCode = Js::OpCode::BrGe_A;
            goto Common_BrEqNeqGeGtLeLt;

        case Js::OpCode::BrLt_A:
            swapSrcsBranchOpCode = Js::OpCode::BrGt_A;
            // fall through

        Common_BrEqNeqGeGtLeLt:
            // Check if src1 is a constant and src2 is not, and facilitate folding the constant into the Cmp instruction
            if( (
                    compareSrc1->IsIntConstOpnd() ||
                    (
                        compareSrc1->IsAddrOpnd() &&
                        Math::FitsInDWord(reinterpret_cast<size_t>(compareSrc1->AsAddrOpnd()->m_address))
                    )
                ) &&
                !compareSrc2->IsIntConstOpnd() &&
                !compareSrc2->IsAddrOpnd())
            {
                // Swap the sources and branch
                IR::Opnd *const tempSrc = compareSrc1;
                compareSrc1 = compareSrc2;
                compareSrc2 = tempSrc;
                branchOpCode = swapSrcsBranchOpCode;
            }

            // Check for compare with zero, to prefer using Test instead of Cmp
            if( !compareSrc1->IsRegOpnd() ||
                !(
                    (compareSrc2->IsIntConstOpnd() && compareSrc2->AsIntConstOpnd()->GetValue() == 0) ||
                    (compareSrc2->IsAddrOpnd() && !compareSrc2->AsAddrOpnd()->m_address)
                ) ||
                branchOpCode == Js::OpCode::BrGt_A || branchOpCode == Js::OpCode::BrLe_A)
            {
                goto Default;
            }
            if(branchOpCode == Js::OpCode::BrGe_A || branchOpCode == Js::OpCode::BrLt_A)
            {
                if(isUnsigned)
                {
                    goto Default;
                }
                branchOpCode = LowererMD::MDCompareWithZeroBranchOpcode(branchOpCode);
            }
            if(!compareSrc2->IsInUse())
            {
                compareSrc2->Free(func);
            }
            InsertTest(compareSrc1, compareSrc1, insertBeforeInstr);
            break;

        default:
        Default:
            InsertCompare(compareSrc1, compareSrc2, insertBeforeInstr);
            break;
    }

    return InsertBranch(branchOpCode, isUnsigned, target, insertBeforeInstr);
}